

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-custom-filter.cc
# Opt level: O2

bool __thiscall SF_XORDecode::setDecodeParms(SF_XORDecode *this,QPDFObjectHandle *decode_parms)

{
  long lVar1;
  uchar *puVar2;
  allocator<char> local_59;
  shared_ptr<Buffer> buf;
  string local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  string local_38 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_38,"/KeyStream",&local_59);
  QPDFObjectHandle::getKey(local_48);
  QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)&buf);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  std::__cxx11::string::~string(local_38);
  lVar1 = Buffer::getSize();
  if (lVar1 == 1) {
    puVar2 = (uchar *)Buffer::getBuffer();
    this->key = *puVar2;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&buf.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return lVar1 == 1;
}

Assistant:

bool
SF_XORDecode::setDecodeParms(QPDFObjectHandle decode_parms)
{
    // For purposes of example, we store the key in a separate stream. We could just as well store
    // the key directly in /DecodeParms, but this example uses a stream to illustrate how one might
    // do that. For example, if implementing /JBIG2Decode, one would need to handle the
    // /JBIG2Globals key, which points to a stream. See comments in SF_XORDecode::registerStream for
    // additional notes on this.
    try {
        // Expect /DecodeParms to be a dictionary with a /KeyStream key that points to a one-byte
        // stream whose single byte is the key. If we are successful at retrieving the key, return
        // true, indicating that we are able to process with the given decode parameters. Under any
        // other circumstances, return false. For other examples of QPDFStreamFilter
        // implementations, look at the classes whose names start with SF_ in the qpdf library
        // implementation.
        auto buf = decode_parms.getKey("/KeyStream").getStreamData();
        if (buf->getSize() != 1) {
            return false;
        }
        this->key = buf->getBuffer()[0];
        return true;
    } catch (std::exception& e) {
        std::cerr << "Error extracting key for /XORDecode: " << e.what() << std::endl;
    }
    return false;
}